

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O2

void __thiscall MetaSim::DetVar::DetVar(DetVar *this,double *a,int s)

{
  ulong uVar1;
  bool bVar2;
  
  RandomVar::RandomVar(&this->super_RandomVar);
  (this->super_RandomVar)._vptr_RandomVar = (_func_int **)&PTR_clone_0017f950;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  uVar1 = 0;
  if (0 < s) {
    uVar1 = (ulong)(uint)s;
  }
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    std::vector<double,_std::allocator<double>_>::push_back(&this->_array,a);
    a = a + 1;
  }
  this->_count = 0;
  return;
}

Assistant:

DetVar::DetVar(double *a, int s)
    {
        for (int i = 0; i < s; ++i) 
            _array.push_back(a[i]);
        _count = 0;
    }